

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::StartsWithOperator,bool,true,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  unsigned_long *puVar5;
  bool *pbVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char **ppcVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  uchar *haystack_1;
  ulong uVar15;
  uchar *haystack;
  idx_t iVar16;
  ulong uVar17;
  bool bVar18;
  char **local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  ulong local_60;
  bool *local_58;
  string_t *local_50;
  ulong local_48;
  unsigned_long *local_40;
  idx_t local_38;
  
  puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_58 = result_data;
  local_50 = ldata;
  if (puVar5 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = *(undefined8 *)&ldata->value;
      pcVar14 = (ldata->value).pointer.ptr;
      uVar7 = (uint)uVar3;
      pcVar12 = (char *)((long)&local_70 + 4);
      if (0xc < uVar7) {
        pcVar12 = pcVar14;
      }
      local_88 = &(rdata->value).pointer.ptr;
      iVar16 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_88 + -1);
        local_80._0_4_ = paVar1->length;
        local_80._4_1_ = paVar1->prefix[0];
        local_80._5_1_ = paVar1->prefix[1];
        local_80._6_1_ = paVar1->prefix[2];
        local_80._7_1_ = paVar1->prefix[3];
        local_78 = *local_88;
        pcVar11 = local_78;
        if ((uint)(undefined4)local_80 < 0xd) {
          pcVar11 = (char *)((long)&local_80 + 4);
        }
        if ((undefined4)local_80 == 0) {
          bVar18 = true;
        }
        else if (uVar7 < (uint)(undefined4)local_80) {
          bVar18 = false;
        }
        else {
          local_70 = uVar3;
          local_68 = pcVar14;
          iVar4 = bcmp(pcVar12,pcVar11,local_80 & 0xffffffff);
          bVar18 = iVar4 == 0;
          result_data = local_58;
        }
        result_data[iVar16] = bVar18;
        iVar16 = iVar16 + 1;
        local_88 = local_88 + 2;
      } while (count != iVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar13 = count + 0x3f >> 6;
    local_60 = 0;
    uVar17 = 0;
    local_48 = uVar13;
    local_40 = puVar5;
    local_38 = count;
    do {
      uVar2 = puVar5[local_60];
      uVar8 = uVar17 + 0x40;
      if (count <= uVar17 + 0x40) {
        uVar8 = count;
      }
      pbVar6 = result_data;
      uVar9 = uVar8;
      if (uVar2 != 0) {
        uVar9 = uVar17;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar17 < uVar8) {
            uVar3 = *(undefined8 *)&local_50->value;
            pcVar14 = (local_50->value).pointer.ptr;
            uVar7 = (uint)uVar3;
            pcVar12 = pcVar14;
            if (uVar7 < 0xd) {
              pcVar12 = (char *)((long)&local_70 + 4);
            }
            ppcVar10 = &rdata[uVar17].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar10 + -1);
              local_80._0_4_ = paVar1->length;
              local_80._4_1_ = paVar1->prefix[0];
              local_80._5_1_ = paVar1->prefix[1];
              local_80._6_1_ = paVar1->prefix[2];
              local_80._7_1_ = paVar1->prefix[3];
              local_78 = *ppcVar10;
              pcVar11 = local_78;
              if ((uint)(undefined4)local_80 < 0xd) {
                pcVar11 = (char *)((long)&local_80 + 4);
              }
              if ((undefined4)local_80 == 0) {
                bVar18 = true;
              }
              else if (uVar7 < (uint)(undefined4)local_80) {
                bVar18 = false;
              }
              else {
                local_70 = uVar3;
                local_68 = pcVar14;
                iVar4 = bcmp(pcVar12,pcVar11,local_80 & 0xffffffff);
                bVar18 = iVar4 == 0;
                result_data = local_58;
              }
              result_data[uVar17] = bVar18;
              uVar17 = uVar17 + 1;
              ppcVar10 = ppcVar10 + 2;
              puVar5 = local_40;
              count = local_38;
              pbVar6 = result_data;
              uVar9 = uVar8;
              uVar13 = local_48;
            } while (uVar8 != uVar17);
          }
        }
        else if (uVar17 < uVar8) {
          ppcVar10 = &rdata[uVar17].value.pointer.ptr;
          uVar15 = 0;
          do {
            if ((uVar2 >> (uVar15 & 0x3f) & 1) != 0) {
              local_70 = *(undefined8 *)&local_50->value;
              local_68 = (local_50->value).pointer.ptr;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar10 + -1);
              local_80._0_4_ = paVar1->length;
              local_80._4_1_ = paVar1->prefix[0];
              local_80._5_1_ = paVar1->prefix[1];
              local_80._6_1_ = paVar1->prefix[2];
              local_80._7_1_ = paVar1->prefix[3];
              local_78 = *ppcVar10;
              pcVar14 = local_68;
              if ((uint)local_70 < 0xd) {
                pcVar14 = (char *)((long)&local_70 + 4);
              }
              pcVar12 = local_78;
              if ((uint)(undefined4)local_80 < 0xd) {
                pcVar12 = (char *)((long)&local_80 + 4);
              }
              if ((undefined4)local_80 == 0) {
                bVar18 = true;
              }
              else if ((uint)local_70 < (uint)(undefined4)local_80) {
                bVar18 = false;
              }
              else {
                iVar4 = bcmp(pcVar14,pcVar12,local_80 & 0xffffffff);
                bVar18 = iVar4 == 0;
                pbVar6 = local_58;
              }
              result_data[uVar15 + uVar17] = bVar18;
            }
            uVar15 = uVar15 + 1;
            ppcVar10 = ppcVar10 + 2;
            puVar5 = local_40;
            count = local_38;
            uVar9 = uVar8;
            uVar13 = local_48;
          } while (uVar8 - uVar17 != uVar15);
        }
      }
      local_60 = local_60 + 1;
      result_data = pbVar6;
      uVar17 = uVar9;
    } while (local_60 != uVar13);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}